

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void ldamath::expdigammify_2<float,(lda_math_mode)0>
               (vw *all,float *gamma,float *norm,float threshold)

{
  float *in_stack_00000028;
  vw *in_stack_00000030;
  
  vexpdigammify_2(in_stack_00000030,in_stack_00000028,(float *)all,gamma._4_4_);
  return;
}

Assistant:

inline void expdigammify_2<float, USE_SIMD>(vw &all, float *gamma, float *norm, const float threshold)
{
#if defined(HAVE_SIMD_MATHMODE)
  vexpdigammify_2(all, gamma, norm, threshold);
#else
  // Do something sensible if SIMD math isn't available:
  expdigammify_2<float, USE_FAST_APPROX>(all, gamma, norm, threshold);
#endif
}